

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

void ThreadContext::GlobalInitialize(void)

{
  PropertyRecord *pPVar1;
  hash_t hVar2;
  int i;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 0x2c9; lVar3 = lVar3 + 1) {
    pPVar1 = builtInPropertyRecords[lVar3];
    hVar2 = JsUtil::CharacterBuffer<char16_t>::InternalGetHashCode<false>
                      ((char16_t *)(pPVar1 + 1),pPVar1->byteCount >> 1);
    pPVar1->hash = hVar2;
  }
  return;
}

Assistant:

void ThreadContext::GlobalInitialize()
{
    for (int i = 0; i < _countof(builtInPropertyRecords); i++)
    {
        builtInPropertyRecords[i]->SetHash(JsUtil::CharacterBuffer<WCHAR>::StaticGetHashCode(builtInPropertyRecords[i]->GetBuffer(), builtInPropertyRecords[i]->GetLength()));
    }
}